

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitileave.hpp
# Opt level: O2

uint64_t bitmanip::detail::remIleavedBits_naive(uint64_t input,size_t bits)

{
  byte bVar1;
  size_t b_out;
  ulong uVar2;
  size_t i;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar2 = 0;
  bVar1 = 0;
  for (uVar3 = 0; uVar3 != 0x40; uVar3 = uVar3 + 1) {
    bVar5 = uVar3 % (bits + 1) == 0;
    uVar4 = (ulong)((uint)input & 1) << (bVar1 & 0x3f);
    if (!bVar5) {
      uVar4 = 0;
    }
    uVar2 = uVar2 | uVar4;
    bVar1 = bVar1 + bVar5;
    input = input >> 1;
  }
  return uVar2;
}

Assistant:

[[nodiscard]] constexpr std::uint64_t remIleavedBits_naive(std::uint64_t input, std::size_t bits) noexcept
{
    // increment once to avoid modulo divisions by 0
    // this way our function is noexcept and safe for all inputs
    ++bits;
    std::uint64_t result = 0;
    for (std::size_t i = 0, b_out = 0; i < 64; ++i) {
        if (i % bits == 0) {
            result |= (input & 1) << b_out++;
        }
        input >>= 1;
    }

    return result;
}